

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.c
# Opt level: O1

ly_bool lyd_validate_autodel_node_del
                  (lyd_node **first,lyd_node *del,lys_module *mod,int np_cont_diff,lyd_node **node,
                  ly_set *node_when,ly_set *node_types,lyd_node **diff)

{
  ly_bool lVar1;
  undefined8 in_RAX;
  lyd_node *plVar2;
  lyd_node_inner *plVar3;
  ly_bool lVar4;
  lyd_node *plVar5;
  uint32_t idx;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  lyd_del_move_root(first,del,mod);
  if ((node == (lyd_node **)0x0) || (*node != del)) {
    lVar4 = '\0';
  }
  else {
    *node = (*node)->next;
    lVar4 = '\x01';
  }
  if (diff != (lyd_node **)0x0) {
    if (((np_cont_diff == 0) && (del->schema->nodetype == 1)) && ((del->schema->flags & 0x80) == 0))
    {
      if (del == (lyd_node *)0x0) {
        plVar5 = (lyd_node *)0x0;
      }
      else {
        plVar5 = *(lyd_node **)(del + 1);
      }
      for (; plVar5 != (lyd_node *)0x0; plVar5 = plVar5->next) {
        lyd_val_diff_add(plVar5,LYD_DIFF_OP_DELETE,diff);
      }
    }
    else {
      lyd_val_diff_add(del,LYD_DIFF_OP_DELETE,diff);
    }
  }
  if ((node_when != (ly_set *)0x0) && (del != (lyd_node *)0x0 && node_when->count != 0)) {
    plVar5 = del;
    do {
      if ((plVar5 != del) &&
         (lVar1 = ly_set_contains(node_when,plVar5,(uint32_t *)((long)&uStack_38 + 4)),
         lVar1 != '\0')) {
        ly_set_rm_index(node_when,uStack_38._4_4_,(_func_void_void_ptr *)0x0);
      }
      if ((plVar5->schema == (lysc_node *)0x0) || ((plVar5->schema->nodetype & 0x711) != 0)) {
        plVar2 = *(lyd_node **)(plVar5 + 1);
      }
      else {
        plVar2 = (lyd_node *)0x0;
      }
      if (plVar2 == (lyd_node *)0x0) {
        if (plVar5 == del) break;
        plVar2 = plVar5->next;
      }
      if (plVar2 == (lyd_node *)0x0) {
        for (plVar3 = plVar5->parent;
            ((plVar3->field_0).node.parent != del->parent &&
            (plVar2 = (plVar3->field_0).node.next, plVar2 == (lyd_node *)0x0));
            plVar3 = (plVar3->field_0).node.parent) {
        }
      }
      plVar5 = plVar2;
    } while (plVar2 != (lyd_node *)0x0);
  }
  if ((node_types != (ly_set *)0x0) && (del != (lyd_node *)0x0 && node_types->count != 0)) {
    plVar5 = del;
    do {
      lVar1 = ly_set_contains(node_types,plVar5,(uint32_t *)((long)&uStack_38 + 4));
      if (lVar1 != '\0') {
        ly_set_rm_index(node_types,uStack_38._4_4_,(_func_void_void_ptr *)0x0);
      }
      if ((plVar5->schema == (lysc_node *)0x0) || ((plVar5->schema->nodetype & 0x711) != 0)) {
        plVar2 = *(lyd_node **)(plVar5 + 1);
      }
      else {
        plVar2 = (lyd_node *)0x0;
      }
      if (plVar2 == (lyd_node *)0x0) {
        if (plVar5 == del) break;
        plVar2 = plVar5->next;
      }
      if (plVar2 == (lyd_node *)0x0) {
        for (plVar3 = plVar5->parent;
            ((plVar3->field_0).node.parent != del->parent &&
            (plVar2 = (plVar3->field_0).node.next, plVar2 == (lyd_node *)0x0));
            plVar3 = (plVar3->field_0).node.parent) {
        }
      }
      plVar5 = plVar2;
    } while (plVar2 != (lyd_node *)0x0);
  }
  lyd_free_tree(del);
  return lVar4;
}

Assistant:

static ly_bool
lyd_validate_autodel_node_del(struct lyd_node **first, struct lyd_node *del, const struct lys_module *mod,
        int np_cont_diff, struct lyd_node **node, struct ly_set *node_when, struct ly_set *node_types, struct lyd_node **diff)
{
    struct lyd_node *iter;
    ly_bool node_autodel = 0;
    uint32_t idx;

    /* update pointers */
    lyd_del_move_root(first, del, mod);
    if (node && (del == *node)) {
        *node = (*node)->next;
        node_autodel = 1;
    }

    if (diff) {
        /* add into diff */
        if (!np_cont_diff && (del->schema->nodetype == LYS_CONTAINER) && !(del->schema->flags & LYS_PRESENCE)) {
            /* we do not want to track NP container changes, but remember any removed children */
            LY_LIST_FOR(lyd_child(del), iter) {
                lyd_val_diff_add(iter, LYD_DIFF_OP_DELETE, diff);
            }
        } else {
            lyd_val_diff_add(del, LYD_DIFF_OP_DELETE, diff);
        }
    }

    if (node_when && node_when->count) {
        /* remove nested from node_when set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if ((del != iter) && ly_set_contains(node_when, iter, &idx)) {
                ly_set_rm_index(node_when, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    if (node_types && node_types->count) {
        /* remove from node_types set */
        LYD_TREE_DFS_BEGIN(del, iter) {
            if (ly_set_contains(node_types, iter, &idx)) {
                ly_set_rm_index(node_types, idx, NULL);
            }
            LYD_TREE_DFS_END(del, iter);
        }
    }

    /* free */
    lyd_free_tree(del);

    return node_autodel;
}